

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O2

int testVisionFeatureObjectPrintBasic(void)

{
  bool bVar1;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *pAVar2;
  FeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *pFVar3;
  FeatureDescription *this_04;
  FeatureDescription *this_05;
  ostream *poVar4;
  VisionFeaturePrint *this_06;
  VisionFeaturePrint_Objects *this_07;
  ostream *this_08;
  int iVar5;
  char *pcVar6;
  undefined1 auStack_b8 [40];
  FeatureType *local_90;
  Result result;
  Model model;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_imagetype(this_00,this);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_01,pAVar2);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  local_90 = this_00;
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,pAVar2);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_03->input_);
  this_04 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&this_03->output_);
  this_05 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&this_03->output_);
  if (pFVar3->type_ != (FeatureType *)0x0) {
    (*(pFVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar3->type_ = local_90;
  if (this_04->type_ != (FeatureType *)0x0) {
    (*(this_04->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this_04->type_ = this_01;
  if (this_05->type_ != (FeatureType *)0x0) {
    (*(this_05->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this_05->type_ = this_02;
  CoreML::Specification::FeatureDescription::set_name(this_04,"a");
  CoreML::Specification::FeatureDescription::set_name(this_05,"b");
  CoreML::Specification::Model::Model(&model);
  if (model.description_ != (ModelDescription *)0x0) {
    (*((model.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  model.description_ = this_03;
  CoreML::validate<(MLModelType)2002>(&result,&model);
  bVar1 = CoreML::Result::good(&result);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((result).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    this_06 = CoreML::Specification::Model::mutable_visionfeatureprint(&model);
    CoreML::validate<(MLModelType)2002>((Result *)auStack_b8,&model);
    CoreML::Result::operator=(&result,(Result *)auStack_b8);
    std::__cxx11::string::~string((string *)(auStack_b8 + 8));
    bVar1 = CoreML::Result::good(&result);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"!((result).good())");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      this_07 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_objects(this_06);
      CoreML::validate<(MLModelType)2002>((Result *)auStack_b8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_b8);
      std::__cxx11::string::~string((string *)(auStack_b8 + 8));
      bVar1 = CoreML::Result::good(&result);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        this_08 = (ostream *)std::operator<<(poVar4,":");
        iVar5 = 0x5f;
LAB_0015b3de:
        poVar4 = (ostream *)std::ostream::operator<<(this_08,iVar5);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar6 = "!((result).good())";
      }
      else {
        this_07->version_ = 1;
        CoreML::validate<(MLModelType)2002>((Result *)auStack_b8,&model);
        CoreML::Result::operator=(&result,(Result *)auStack_b8);
        std::__cxx11::string::~string((string *)(auStack_b8 + 8));
        bVar1 = CoreML::Result::good(&result);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                  );
          this_08 = (ostream *)std::operator<<(poVar4,":");
          iVar5 = 99;
          goto LAB_0015b3de;
        }
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output(this_07,"a");
        CoreML::validate<(MLModelType)2002>((Result *)auStack_b8,&model);
        CoreML::Result::operator=(&result,(Result *)auStack_b8);
        std::__cxx11::string::~string((string *)(auStack_b8 + 8));
        bVar1 = CoreML::Result::good(&result);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                  );
          this_08 = (ostream *)std::operator<<(poVar4,":");
          iVar5 = 0x67;
          goto LAB_0015b3de;
        }
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output(this_07,"b");
        CoreML::validate<(MLModelType)2002>((Result *)auStack_b8,&model);
        CoreML::Result::operator=(&result,(Result *)auStack_b8);
        std::__cxx11::string::~string((string *)(auStack_b8 + 8));
        bVar1 = CoreML::Result::good(&result);
        iVar5 = 0;
        if (bVar1) goto LAB_0015b41f;
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6a);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar6 = "(result).good()";
      }
      poVar4 = std::operator<<(poVar4,pcVar6);
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar5 = 1;
LAB_0015b41f:
  std::__cxx11::string::~string((string *)&result.m_message);
  CoreML::Specification::Model::~Model(&model);
  return iVar5;
}

Assistant:

int testVisionFeatureObjectPrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* output1ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output1FeatureType = new Specification::FeatureType();
    output1FeatureType->set_allocated_multiarraytype(output1ArrayFeatureType);
    
    Specification::ArrayFeatureType* output2ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output2FeatureType = new Specification::FeatureType();
    output2FeatureType->set_allocated_multiarraytype(output2ArrayFeatureType);
    
    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output1 = description->add_output();
    Specification::FeatureDescription* output2 = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output1->set_allocated_type(output1FeatureType);
    output2->set_allocated_type(output2FeatureType);

    output1->set_name("a");
    output2->set_name("b");

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto objects = preprocessing->mutable_objects();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->set_version(Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->add_output("a");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);
    objects->add_output("b");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}